

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O2

void helper_vmsumuhm_ppc64
               (CPUPPCState_conflict2 *env,ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b,ppc_avr_t *c)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  uint32_t prod [8];
  
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    prod[lVar2] = (uint)b->u16[lVar2] * (uint)a->u16[lVar2];
  }
  uVar3 = 7;
  for (uVar1 = 3; -1 < (int)uVar1; uVar1 = uVar1 - 1) {
    r->u32[uVar1] = prod[uVar3 - 1] + c->u32[uVar1] + prod[uVar3];
    uVar3 = uVar3 - 2;
  }
  return;
}

Assistant:

void helper_vmsumuhm(CPUPPCState *env, ppc_avr_t *r, ppc_avr_t *a,
                     ppc_avr_t *b, ppc_avr_t *c)
{
    uint32_t prod[8];
    int i;

    for (i = 0; i < ARRAY_SIZE(r->u16); i++) {
        prod[i] = a->u16[i] * b->u16[i];
    }

    VECTOR_FOR_INORDER_I(i, u32) {
        r->u32[i] = c->u32[i] + prod[2 * i] + prod[2 * i + 1];
    }
}